

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall
cmFindCommon::RerootPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  char *pcVar3;
  string *psVar4;
  pointer cDir;
  string *r;
  string *path;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  string rootedDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  roots;
  char *sysrootLink;
  char *sysrootCompile;
  char *sysroot;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrootedPaths;
  allocator<char> local_d9;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  cmFindCommon *local_78;
  string *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (this->FindRootPathMode != RootPathModeNever) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_SYSROOT",(allocator<char> *)&local_68);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    pcVar1 = (this->super_cmCommand).Makefile;
    local_90 = pcVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_SYSROOT_COMPILE",(allocator<char> *)&local_68);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    pcVar1 = (this->super_cmCommand).Makefile;
    local_98 = pcVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_SYSROOT_LINK",(allocator<char> *)&local_68);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    pcVar1 = (this->super_cmCommand).Makefile;
    local_a0 = pcVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"CMAKE_FIND_ROOT_PATH",(allocator<char> *)&local_68);
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (local_90 == (char *)0x0) {
      bVar5 = false;
    }
    else {
      bVar5 = *local_90 != '\0';
    }
    if (local_98 == (char *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = *local_98 != '\0';
    }
    if (local_a0 == (char *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = *local_a0 != '\0';
    }
    if (pcVar3 == (char *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = *pcVar3 != '\0';
    }
    if (((bool)(bVar5 | bVar6 | bVar7)) || (bVar8)) {
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar3,(allocator<char> *)&local_68);
        cmSystemTools::ExpandListArgument(&local_d8,&local_b8,false);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if (local_98 != (char *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_98);
      }
      if (local_a0 != (char *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_a0);
      }
      path = local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      psVar4 = local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_90 != (char *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_90);
        path = local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; path != psVar4; path = path + 1) {
        cmsys::SystemTools::ConvertToUnixSlashes(path);
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"CMAKE_STAGING_PREFIX",(allocator<char> *)&local_68);
      local_88 = cmMakefile::GetDefinition(pcVar1,&local_d8);
      local_78 = this;
      std::__cxx11::string::~string((string *)&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,paths);
      local_80 = paths;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(paths);
      local_70 = local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (cDir = local_b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          psVar4 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, cDir != local_70; cDir = cDir + 1) {
        for (; psVar4 != pbVar2; psVar4 = psVar4 + 1) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          local_d8._M_string_length = 0;
          local_d8.field_2._M_local_buf[0] = '\0';
          bVar5 = cmsys::SystemTools::IsSubDirectory(psVar4,cDir);
          if (bVar5) {
LAB_0030487d:
            std::__cxx11::string::_M_assign((string *)&local_d8);
          }
          else {
            if (local_88 != (char *)0x0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_68,local_88,&local_d9);
              bVar5 = cmsys::SystemTools::IsSubDirectory(psVar4,&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              if (bVar5) goto LAB_0030487d;
            }
            if ((psVar4->_M_string_length != 0) && (*(psVar4->_M_dataplus)._M_p != '~')) {
              std::__cxx11::string::_M_assign((string *)&local_d8);
              std::__cxx11::string::append((char *)&local_d8);
              cmsys::SystemTools::SplitPathRootComponent(psVar4,(string *)0x0);
              std::__cxx11::string::append((char *)&local_d8);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_80,&local_d8);
          std::__cxx11::string::~string((string *)&local_d8);
        }
      }
      if (local_78->FindRootPathMode == RootPathModeBoth) {
        cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (local_80,&local_48);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
    }
  }
  return;
}

Assistant:

void cmFindCommon::RerootPaths(std::vector<std::string>& paths)
{
#if 0
  for(std::string const& p : paths)
    {
    fprintf(stderr, "[%s]\n", p.c_str());
    }
#endif
  // Short-circuit if there is nothing to do.
  if (this->FindRootPathMode == RootPathModeNever) {
    return;
  }

  const char* sysroot = this->Makefile->GetDefinition("CMAKE_SYSROOT");
  const char* sysrootCompile =
    this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE");
  const char* sysrootLink =
    this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK");
  const char* rootPath = this->Makefile->GetDefinition("CMAKE_FIND_ROOT_PATH");
  const bool noSysroot = !sysroot || !*sysroot;
  const bool noCompileSysroot = !sysrootCompile || !*sysrootCompile;
  const bool noLinkSysroot = !sysrootLink || !*sysrootLink;
  const bool noRootPath = !rootPath || !*rootPath;
  if (noSysroot && noCompileSysroot && noLinkSysroot && noRootPath) {
    return;
  }

  // Construct the list of path roots with no trailing slashes.
  std::vector<std::string> roots;
  if (rootPath) {
    cmSystemTools::ExpandListArgument(rootPath, roots);
  }
  if (sysrootCompile) {
    roots.emplace_back(sysrootCompile);
  }
  if (sysrootLink) {
    roots.emplace_back(sysrootLink);
  }
  if (sysroot) {
    roots.emplace_back(sysroot);
  }
  for (std::string& r : roots) {
    cmSystemTools::ConvertToUnixSlashes(r);
  }

  const char* stagePrefix =
    this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");

  // Copy the original set of unrooted paths.
  std::vector<std::string> unrootedPaths = paths;
  paths.clear();

  for (std::string const& r : roots) {
    for (std::string const& up : unrootedPaths) {
      // Place the unrooted path under the current root if it is not
      // already inside.  Skip the unrooted path if it is relative to
      // a user home directory or is empty.
      std::string rootedDir;
      if (cmSystemTools::IsSubDirectory(up, r) ||
          (stagePrefix && cmSystemTools::IsSubDirectory(up, stagePrefix))) {
        rootedDir = up;
      } else if (!up.empty() && up[0] != '~') {
        // Start with the new root.
        rootedDir = r;
        rootedDir += "/";

        // Append the original path with its old root removed.
        rootedDir += cmSystemTools::SplitPathRootComponent(up);
      }

      // Store the new path.
      paths.push_back(rootedDir);
    }
  }

  // If searching both rooted and unrooted paths add the original
  // paths again.
  if (this->FindRootPathMode == RootPathModeBoth) {
    cmAppend(paths, unrootedPaths);
  }
}